

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O2

QRect __thiscall QWidgetEffectSourcePrivate::deviceRect(QWidgetEffectSourcePrivate *this)

{
  QWidget *this_00;
  QRect QVar1;
  
  this_00 = QWidget::window(this->m_widget);
  QVar1 = QWidget::rect(this_00);
  return QVar1;
}

Assistant:

QRect deviceRect() const override
    { return m_widget->window()->rect(); }